

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn_pack.cc
# Opt level: O0

void * ASN1_item_unpack(ASN1_STRING *oct,ASN1_ITEM *it)

{
  void *ret;
  uchar *p;
  ASN1_ITEM *it_local;
  ASN1_STRING *oct_local;
  
  ret = oct->data;
  p = (uchar *)it;
  it_local = (ASN1_ITEM *)oct;
  oct_local = (ASN1_STRING *)ASN1_item_d2i((ASN1_VALUE **)0x0,(uchar **)&ret,(long)oct->length,it);
  if ((oct_local == (ASN1_STRING *)0x0) ||
     (ret != (void *)((long)&it_local->templates->flags + (long)*(int *)it_local))) {
    ERR_put_error(0xc,0,0x6d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn_pack.cc"
                  ,0x33);
    ASN1_item_free((ASN1_VALUE *)oct_local,(ASN1_ITEM *)p);
    oct_local = (ASN1_STRING *)0x0;
  }
  return oct_local;
}

Assistant:

void *ASN1_item_unpack(const ASN1_STRING *oct, const ASN1_ITEM *it) {
  const unsigned char *p = oct->data;
  void *ret = ASN1_item_d2i(NULL, &p, oct->length, it);
  if (ret == NULL || p != oct->data + oct->length) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    ASN1_item_free(reinterpret_cast<ASN1_VALUE *>(ret), it);
    return NULL;
  }
  return ret;
}